

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Writer.h
# Opt level: O1

string * __thiscall
CSV::Writer<Protein>::EscapeStringForCSV
          (string *__return_storage_ptr__,Writer<Protein> *this,string *value)

{
  pointer pcVar1;
  char *pcVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (value->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + value->_M_string_length);
  if ((value->_M_string_length != 0) &&
     (pcVar2 = std::
               __find_if<char_const*,__gnu_cxx::__ops::_Iter_pred<CSV::Writer<Protein>::EscapeStringForCSV(std::__cxx11::string_const&)::_lambda(char)_1_>>
                         (&EscapeStringForCSV::escapingRequiredChars,"N6Alnout6WriterI7ProteinEE",
                          value), pcVar2 == "N6Alnout6WriterI7ProteinEE")) {
    return __return_storage_ptr__;
  }
  std::__cxx11::string::insert((ulong)__return_storage_ptr__,0,'\x01');
  std::__cxx11::string::push_back((char)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string EscapeStringForCSV( const std::string& value ) {
    std::string ret = value;

    static const std::array< char, 4 > escapingRequiredChars = { ',', '\"', '\r', '\n' };

    bool needsEscaping =
      value.empty() ||
      std::any_of(
        escapingRequiredChars.begin(), escapingRequiredChars.end(),
        [&]( const char ch ) { return value.find( ch ) != std::string::npos; } );

    if( needsEscaping ) {
      ret.insert( 0, 1, '\"' );
      ret += '\"';
    }

    return ret;
  }